

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

void AddSynonymField(Col_Word *wordPtr)

{
  int iVar1;
  Cell *pacVar2;
  uint local_2c;
  uint local_28;
  uint local_24;
  FloatConvert c;
  Col_Word converted;
  Col_Word *wordPtr_local;
  
  pacVar2 = AllocCells(1);
  if (*wordPtr == 0) {
    local_24 = 0;
  }
  else {
    if ((*wordPtr & 0xf) == 0) {
      if ((*(byte *)*wordPtr & 2) == 0) {
        local_2c = 0xffffffff;
      }
      else {
        local_2c = *(byte *)*wordPtr & 0xfffffffe;
      }
      local_28 = local_2c;
    }
    else {
      local_28 = immediateWordTypes[*wordPtr & 0x1f];
    }
    local_24 = local_28;
  }
  if (local_24 == 0xfffffffd) {
    (*pacVar2)[0] = '\x02';
    (*pacVar2)[1] = '\0';
    *(char *)((long)pacVar2 + 2) = '\b';
    *(char *)((long)pacVar2 + 3) = '\0';
    *(char *)((long)pacVar2 + 8) = '\0';
    *(char *)((long)pacVar2 + 9) = '\0';
    *(char *)((long)pacVar2 + 10) = '\0';
    *(char *)((long)pacVar2 + 0xb) = '\0';
    *(char *)((long)pacVar2 + 0xc) = '\0';
    *(char *)((long)pacVar2 + 0xd) = '\0';
    *(char *)((long)pacVar2 + 0xe) = '\0';
    *(char *)((long)pacVar2 + 0xf) = '\0';
    *(Col_Word *)(*pacVar2 + 0x10) = *wordPtr & 0xfffffffffffffffc;
  }
  else if (local_24 == 0xfffffffe) {
    (*pacVar2)[0] = '\x02';
    (*pacVar2)[1] = '\0';
    *(char *)((long)pacVar2 + 2) = '\x04';
    *(char *)((long)pacVar2 + 3) = '\0';
    *(char *)((long)pacVar2 + 8) = '\0';
    *(char *)((long)pacVar2 + 9) = '\0';
    *(char *)((long)pacVar2 + 10) = '\0';
    *(char *)((long)pacVar2 + 0xb) = '\0';
    *(char *)((long)pacVar2 + 0xc) = '\0';
    *(char *)((long)pacVar2 + 0xd) = '\0';
    *(char *)((long)pacVar2 + 0xe) = '\0';
    *(char *)((long)pacVar2 + 0xf) = '\0';
    *(long *)(*pacVar2 + 0x10) = (long)*wordPtr >> 1;
  }
  else {
    (*pacVar2)[0] = '\x02';
    (*pacVar2)[1] = '\0';
    iVar1 = Col_WordType(*wordPtr);
    *(short *)(*pacVar2 + 2) = (short)iVar1;
    *(char *)((long)pacVar2 + 8) = '\0';
    *(char *)((long)pacVar2 + 9) = '\0';
    *(char *)((long)pacVar2 + 10) = '\0';
    *(char *)((long)pacVar2 + 0xb) = '\0';
    *(char *)((long)pacVar2 + 0xc) = '\0';
    *(char *)((long)pacVar2 + 0xd) = '\0';
    *(char *)((long)pacVar2 + 0xe) = '\0';
    *(char *)((long)pacVar2 + 0xf) = '\0';
    *(Col_Word *)(*pacVar2 + 0x10) = *wordPtr;
  }
  *wordPtr = (Col_Word)pacVar2;
  return;
}

Assistant:

static void
AddSynonymField(
    Col_Word *wordPtr)  /*!< Points to the word to convert. */
{
    Col_Word converted;

    ASSERT(!HasSynonymField(*wordPtr));

    /*!
     * @sideeffect
     * Allocates memory cells.
     */
    converted = (Col_Word) AllocCells(1);
    switch (WORD_TYPE(*wordPtr)) {
    /*
     * Some types have dedicated wrappers.
     */

    case WORD_TYPE_SMALLINT:
        WORD_INTWRAP_INIT(converted, 0, WORD_SMALLINT_VALUE(*wordPtr));
        break;

    case WORD_TYPE_SMALLFP: {
        FloatConvert c;
        WORD_FPWRAP_INIT(converted, 0, WORD_SMALLFP_VALUE(*wordPtr, c));
        break;
    }

    default:
        /*
         * Use generic wrapper.
         */

        WORD_WRAP_INIT(converted, 0, Col_WordType(*wordPtr), *wordPtr);
        break;
    }

    *wordPtr = converted;
}